

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>::
     Window<duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>,duckdb::date_t,duckdb::timestamp_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  bool bVar1;
  CursorType *dmask_p;
  idx_t iVar2;
  timestamp_t *ptVar3;
  timestamp_t tVar4;
  SubFrames *in_RCX;
  CursorType *in_RDX;
  WindowQuantileState<duckdb::date_t> *in_RSI;
  IncludedType *in_R8;
  long in_stack_00000008;
  WindowQuantileState<duckdb::date_t> *window_state;
  value_type *quantile;
  ValidityMask *rmask;
  timestamp_t *rdata;
  QuantileBindData *bind_data;
  idx_t n;
  QuantileIncluded<duckdb::date_t> included;
  ValidityMask *fmask;
  CursorType *data;
  QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *gstate;
  QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *state;
  vector<duckdb::FrameBounds,_true> *in_stack_ffffffffffffff58;
  QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff60;
  WindowPartitionInput *in_stack_ffffffffffffff68;
  QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff70;
  CURSOR_TYPE *in_stack_ffffffffffffffa8;
  QuantileIncluded<duckdb::date_t> *included_00;
  CursorType *data_00;
  
  data_00 = in_RDX;
  dmask_p = QuantileState<duckdb::date_t,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  included_00 = (QuantileIncluded<duckdb::date_t> *)
                (in_RSI->m).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  QuantileIncluded<duckdb::date_t>::QuantileIncluded
            ((QuantileIncluded<duckdb::date_t> *)&stack0xffffffffffffffa0,
             (ValidityMask *)included_00,dmask_p);
  iVar2 = QuantileOperation::FrameSize<duckdb::date_t>
                    (included_00,(SubFrames *)in_stack_ffffffffffffffa8);
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff60);
  FunctionData::Cast<duckdb::QuantileBindData>((FunctionData *)in_stack_ffffffffffffff60);
  ptVar3 = FlatVector::GetData<duckdb::timestamp_t>((Vector *)0xa7ab3d);
  FlatVector::Validity((Vector *)0xa7ab4c);
  if (iVar2 == 0) {
    TemplatedValidityMask<unsigned_long>::Set
              ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff70,
               (idx_t)in_stack_ffffffffffffff68,SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
  }
  else {
    vector<duckdb::QuantileValue,_true>::operator[]
              ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffff60,
               (size_type)in_stack_ffffffffffffff58);
    if ((in_RDX == (CursorType *)0x0) ||
       (bVar1 = QuantileState<duckdb::date_t,_duckdb::QuantileStandardType>::HasTree
                          (in_stack_ffffffffffffff60), !bVar1)) {
      QuantileState<duckdb::date_t,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                (in_stack_ffffffffffffff60);
      WindowQuantileState<duckdb::date_t>::UpdateSkip(in_RSI,data_00,in_RCX,in_R8);
      tVar4 = WindowQuantileState<duckdb::date_t>::WindowScalar<duckdb::timestamp_t,false>
                        ((WindowQuantileState<duckdb::date_t> *)fmask,included.dmask,
                         (SubFrames *)included.fmask,n,(Vector *)bind_data,(QuantileValue *)rdata);
      ptVar3[in_stack_00000008].value = tVar4.value;
      vector<duckdb::FrameBounds,_true>::operator=
                ((vector<duckdb::FrameBounds,_true> *)tVar4.value,in_stack_ffffffffffffff58);
    }
    else {
      QuantileState<duckdb::date_t,_duckdb::QuantileStandardType>::GetWindowState
                ((QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *)0xa7abab);
      tVar4 = WindowQuantileState<duckdb::date_t>::WindowScalar<duckdb::timestamp_t,false>
                        ((WindowQuantileState<duckdb::date_t> *)fmask,included.dmask,
                         (SubFrames *)included.fmask,n,(Vector *)bind_data,(QuantileValue *)rdata);
      ptVar3[in_stack_00000008].value = tVar4.value;
    }
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);

		if (!n) {
			rmask.Set(ridx, false);
			return;
		}

		const auto &quantile = bind_data.quantiles[0];
		if (gstate && gstate->HasTree()) {
			rdata[ridx] = gstate->GetWindowState().template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result,
			                                                                                    quantile);
		} else {
			auto &window_state = state.GetOrCreateWindowState();

			//	Update the skip list
			window_state.UpdateSkip(data, frames, included);

			// Find the position(s) needed
			rdata[ridx] = window_state.template WindowScalar<RESULT_TYPE, DISCRETE>(data, frames, n, result, quantile);

			//	Save the previous state for next time
			window_state.prevs = frames;
		}
	}